

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePartCachedFunction<duckdb::DatePart::YearOperator,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  UnifiedVectorFormat *pUVar2;
  int64_t *piVar3;
  int64_t *piVar4;
  ulong uVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  byte bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar10;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar11;
  date_t dVar12;
  reference vector;
  UnifiedVectorFormat *pUVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  int64_t iVar16;
  ulong uVar17;
  long lVar18;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar19;
  VectorType VVar20;
  UnifiedVectorFormat *pUVar21;
  UnifiedVectorFormat *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  long local_a8;
  reference local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  unsigned_long local_80;
  optional_ptr<duckdb::FunctionLocalState,_true> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_78.ptr = *(FunctionLocalState **)(state + 0xb0);
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_78);
  oVar10.ptr = local_78.ptr;
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pUVar2 = *(UnifiedVectorFormat **)(args + 0x18);
  VVar20 = (VectorType)result;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar20);
    lVar18 = *(long *)(result + 0x20);
    lVar6 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (*(long *)(vector + 0x28) == 0) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        pUVar19 = (UnifiedVectorFormat *)0x0;
        do {
          dVar12.days = duckdb::Timestamp::GetDate
                                  ((timestamp_t)*(int64_t *)(lVar6 + (long)pUVar19 * 8));
          iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar10.ptr + 8),
                              dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar19);
          *(int64_t *)(lVar18 + (long)pUVar19 * 8) = iVar16;
          pUVar19 = pUVar19 + 1;
        } while (pUVar2 != pUVar19);
      }
    }
    else {
      *(UnifiedVectorFormat **)(result + 0x40) = pUVar2;
      local_b8 = pUVar2;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)(vector + 0x28),(unsigned_long *)&local_b8);
      p_Var9 = p_Stack_70;
      oVar11.ptr = local_78.ptr;
      local_78.ptr = (FunctionLocalState *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(FunctionLocalState **)(result + 0x30) = oVar11.ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var9;
      if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
         p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
      pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (result + 0x30));
      *(unsigned_long **)pVVar1 =
           (unsigned_long *)
           (pTVar14->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if ((UnifiedVectorFormat *)0x3f < pUVar2 + 0x3f) {
        local_98 = 0;
        pUVar19 = (UnifiedVectorFormat *)0x0;
        local_a8 = lVar18;
        local_a0 = vector + 0x28;
        do {
          if (*(long *)local_a0 == 0) {
            pUVar13 = pUVar19 + 0x40;
            if (pUVar2 <= pUVar19 + 0x40) {
              pUVar13 = pUVar2;
            }
LAB_005c5c9c:
            pUVar21 = pUVar19;
            if (pUVar19 < pUVar13) {
              do {
                dVar12.days = duckdb::Timestamp::GetDate
                                        ((timestamp_t)*(int64_t *)(lVar6 + (long)pUVar19 * 8));
                iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                                   ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                                    (oVar10.ptr + 8),dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar19);
                *(int64_t *)(lVar18 + (long)pUVar19 * 8) = iVar16;
                pUVar19 = pUVar19 + 1;
                pUVar21 = pUVar13;
              } while (pUVar13 != pUVar19);
            }
          }
          else {
            uVar5 = *(ulong *)(*(long *)local_a0 + local_98 * 8);
            pUVar13 = pUVar19 + 0x40;
            if (pUVar2 <= pUVar19 + 0x40) {
              pUVar13 = pUVar2;
            }
            pUVar21 = pUVar13;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_005c5c9c;
              pUVar21 = pUVar19;
              if (pUVar19 < pUVar13) {
                local_88 = lVar18 + (long)pUVar19 * 8;
                local_90 = (long)pUVar19 * 8 + lVar6;
                uVar17 = 0;
                do {
                  if ((uVar5 >> (uVar17 & 0x3f) & 1) != 0) {
                    dVar12.days = duckdb::Timestamp::GetDate
                                            ((timestamp_t)*(int64_t *)(local_90 + uVar17 * 8));
                    iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                                       ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                                        (oVar10.ptr + 8),dVar12,(ValidityMask *)pVVar1,
                                        (idx_t)(pUVar19 + uVar17));
                    *(int64_t *)(local_88 + uVar17 * 8) = iVar16;
                  }
                  uVar17 = uVar17 + 1;
                  lVar18 = local_a8;
                  pUVar21 = pUVar13;
                } while ((long)pUVar13 - (long)pUVar19 != uVar17);
              }
            }
          }
          local_98 = local_98 + 1;
          pUVar19 = pUVar21;
        } while (local_98 != (ulong)(pUVar2 + 0x3f) >> 6);
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar20);
    piVar3 = *(int64_t **)(result + 0x20);
    piVar4 = *(int64_t **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      dVar12.days = duckdb::Timestamp::GetDate((timestamp_t)*piVar4);
      iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar10.ptr + 8),dVar12
                          ,(ValidityMask *)(result + 0x28),0);
      *piVar3 = iVar16;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar2);
    duckdb::Vector::SetVectorType(VVar20);
    oVar11.ptr = local_78.ptr;
    lVar18 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (local_68 == 0) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        lVar6 = *(long *)oVar11.ptr;
        pUVar19 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar13 = pUVar19;
          if (lVar6 != 0) {
            pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar19 * 4);
          }
          dVar12.days = duckdb::Timestamp::GetDate
                                  ((timestamp_t)*(int64_t *)((long)p_Stack_70 + (long)pUVar13 * 8));
          iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar10.ptr + 8),
                              dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar19);
          *(int64_t *)(lVar18 + (long)pUVar19 * 8) = iVar16;
          pUVar19 = pUVar19 + 1;
        } while (pUVar2 != pUVar19);
      }
    }
    else if (pUVar2 != (UnifiedVectorFormat *)0x0) {
      lVar6 = *(long *)oVar11.ptr;
      pUVar19 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar13 = pUVar19;
        if (lVar6 != 0) {
          pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar19 * 4);
        }
        if ((*(ulong *)(local_68 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1) == 0)
        {
          _Var15._M_head_impl = *(unsigned_long **)pVVar1;
          if (_Var15._M_head_impl == (unsigned_long *)0x0) {
            local_80 = *(unsigned_long *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_b8,&local_80);
            p_Var9 = p_Stack_b0;
            pUVar13 = local_b8;
            local_b8 = (UnifiedVectorFormat *)0x0;
            p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(UnifiedVectorFormat **)(result + 0x30) = pUVar13;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var9;
            if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
               p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var15._M_head_impl =
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)pVVar1 = _Var15._M_head_impl;
          }
          bVar8 = (byte)pUVar19 & 0x3f;
          _Var15._M_head_impl[(ulong)pUVar19 >> 6] =
               _Var15._M_head_impl[(ulong)pUVar19 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          dVar12.days = duckdb::Timestamp::GetDate
                                  ((timestamp_t)*(int64_t *)((long)p_Stack_70 + (long)pUVar13 * 8));
          iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar10.ptr + 8),
                              dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar19);
          *(int64_t *)(lVar18 + (long)pUVar19 * 8) = iVar16;
        }
        pUVar19 = pUVar19 + 1;
      } while (pUVar2 != pUVar19);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}